

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::TypenameFunction::TypenameFunction(TypenameFunction *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,Typename,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00b7f4f0;
  return;
}

Assistant:

TypenameFunction() : SystemSubroutine(KnownSystemName::Typename, SubroutineKind::Function) {}